

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

char * get_char_color(CHAR_DATA *ch,char *event)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var3;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  ulong uVar4;
  int local_1c;
  long local_10;
  char *local_8;
  
  iVar2 = get_event_number((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar4 = *(ulong *)(in_RDI + 400);
  _Var3 = std::pow<int,int>(0,0x65c74c);
  if ((uVar4 & (long)_Var3) == 0) {
    local_10 = in_RDI;
    if ((*(long *)(in_RDI + 0x80) != 0) && (*(long *)(*(long *)(in_RDI + 0x80) + 0x18) != 0)) {
      local_10 = *(long *)(*(long *)(in_RDI + 0x80) + 0x18);
    }
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      local_8 = "";
    }
    else {
      uVar4 = *(ulong *)(local_10 + 400);
      _Var3 = std::pow<int,int>(0,0x65c802);
      if ((uVar4 & (long)_Var3) == 0) {
        local_8 = "";
      }
      else if (iVar2 < 0) {
        for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
          bVar1 = str_cmp(in_RSI,color_table[local_1c].color_name);
          if (!bVar1) {
            return color_table[local_1c].color_ascii;
          }
        }
        local_8 = "";
      }
      else {
        local_8 = color_name_to_ascii((char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                       in_stack_ffffffffffffffc8));
      }
    }
  }
  else {
    iVar2 = number_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_8 = color_table[iVar2].color_ascii;
  }
  return local_8;
}

Assistant:

char *get_char_color(CHAR_DATA *ch, char *event)
{
	int i = get_event_number(event);

	if (IS_SET(ch->comm, COMM_LOTS_O_COLOR))
		return color_table[number_range(0, MAX_COLORS - 1)].color_ascii;

	if (ch->desc != nullptr && ch->desc->original != nullptr)
		ch = ch->desc->original;

	if (is_npc(ch))
		return "";

	if (!IS_SET(ch->comm, COMM_ANSI))
		return "";

	if (i >= 0)
		return color_name_to_ascii(ch->pcdata->color_scheme[i]);

	for (i = 0; i < MAX_COLORS; i++)
	{
		if (!str_cmp(event, color_table[i].color_name))
			return color_table[i].color_ascii;
	}

	return "";
}